

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

void __thiscall
spatial_region::f_init_cos
          (spatial_region *this,double a0y,double a0z,double xsigma,double ysigma,double zsigma,
          double x0,int sscos,bool b_sign,double x1,double phase,double y0,double z0,bool append,
          double phi,double xtarget,double ytarget,double ztarget)

{
  undefined8 *puVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  int iVar24;
  celle *pcVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint uVar35;
  cellb *pcVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  bool bVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [64];
  double dVar95;
  double dVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [64];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  double dVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 in_register_000012c8 [56];
  undefined1 in_register_00001308 [56];
  undefined8 in_XMM5_Qb;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 in_register_00001388 [56];
  undefined1 auVar131 [16];
  ulong uVar132;
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 in_ZMM24 [64];
  undefined1 auVar138 [64];
  undefined1 in_ZMM25 [64];
  undefined1 auVar139 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar140 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar141 [64];
  undefined1 in_XMM30 [16];
  double local_288;
  ulong local_270;
  double local_248;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  undefined1 auVar46 [16];
  
  auVar55 = in_ZMM27._0_16_;
  auVar54 = in_ZMM24._0_16_;
  auVar53 = in_ZMM25._0_16_;
  auVar52 = in_ZMM26._0_16_;
  auVar117._8_56_ = in_register_00001388;
  auVar117._0_8_ = x1;
  auVar94._8_56_ = in_register_00001308;
  auVar94._0_8_ = zsigma;
  auVar133._8_56_ = in_register_000012c8;
  auVar133._0_8_ = ysigma;
  if (sscos == 0) {
    dVar95 = ((xsigma + xsigma) * 2.5066282746310002) / 3.0;
    auVar44 = vunpcklpd_avx(auVar94._0_16_,auVar133._0_16_);
    auVar76._0_8_ = auVar44._0_8_ + auVar44._0_8_;
    auVar76._8_8_ = auVar44._8_8_ + auVar44._8_8_;
    auVar44._8_8_ = 0x40040d931ff62705;
    auVar44._0_8_ = 0x40040d931ff62705;
    auVar44 = vmulpd_avx512vl(auVar76,auVar44);
    auVar45._8_8_ = 0x4008000000000000;
    auVar45._0_8_ = 0x4008000000000000;
    local_1f8 = vdivpd_avx512vl(auVar44,auVar45);
    goto LAB_0010ef4e;
  }
  if (sscos == 3) {
    dVar95 = ((xsigma + xsigma) * 2.5066282746310002) / 3.0;
  }
  else {
    if (sscos == 2) {
      dVar95 = ((xsigma + xsigma) * 2.5066282746310002) / 3.0;
      local_1f8._8_8_ = ysigma * 100.0;
      local_1f8._0_8_ = ysigma * 100.0;
      goto LAB_0010ef4e;
    }
    if (sscos != 1) {
      local_1f8 = ZEXT816(0);
      dVar95 = 0.0;
      goto LAB_0010ef4e;
    }
    dVar95 = xsigma * 0.822;
  }
  auVar44 = vunpcklpd_avx(auVar94._0_16_,auVar133._0_16_);
  auVar26._8_8_ = 0x3fea4dd2f1a9fbe7;
  auVar26._0_8_ = 0x3fea4dd2f1a9fbe7;
  local_1f8 = vmulpd_avx512vl(auVar44,auVar26);
LAB_0010ef4e:
  iVar23 = this->ny;
  local_288 = this->dy;
  dVar4 = this->dz;
  iVar24 = this->nz;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = y0 * y0;
  auVar44 = vfmadd231sd_fma(auVar77,auVar117._0_16_,auVar117._0_16_);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = z0;
  auVar44 = vfmadd231sd_fma(auVar44,auVar97,auVar97);
  if (auVar44._0_8_ < 0.0) {
    dVar61 = sqrt(auVar44._0_8_);
  }
  else {
    auVar44 = vsqrtsd_avx(auVar44,auVar44);
    dVar61 = auVar44._0_8_;
  }
  auVar48._8_8_ = 0;
  auVar48._0_8_ = z0;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = y0;
  auVar44 = vunpcklpd_avx(auVar51,auVar48);
  auVar49._0_8_ = auVar44._0_8_ ^ 0x8000000000000000;
  auVar49._8_8_ = auVar44._8_8_ ^ 0x8000000000000000;
  auVar131._0_8_ = -x1 / dVar61;
  auVar131._8_8_ = in_register_00001388._0_8_ ^ 0x8000000000000000;
  auVar50._8_8_ = dVar61;
  auVar50._0_8_ = dVar61;
  auVar44 = vdivpd_avx(auVar49,auVar50);
  dVar61 = auVar44._0_8_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = dVar61 * dVar61;
  auVar45 = vfmadd231sd_fma(auVar47,auVar131,auVar131);
  if (auVar45._0_8_ < 0.0) {
    dVar60 = sqrt(auVar45._0_8_);
  }
  else {
    auVar45 = vsqrtsd_avx(auVar45,auVar45);
    dVar60 = auVar45._0_8_;
  }
  uVar35 = 0;
  auVar133 = ZEXT864(0) << 0x40;
  auVar98._0_8_ = -dVar61;
  auVar98._8_8_ = auVar44._8_8_ ^ 0x8000000000000000;
  auVar45 = vunpcklpd_avx(auVar98,auVar131);
  auVar56._8_8_ = dVar60;
  auVar56._0_8_ = dVar60;
  if (dVar60 != 0.0) {
    uVar35 = 0xff;
  }
  if (NAN(dVar60)) {
    uVar35 = 0xff;
  }
  auVar76 = vmovhpd_avx(ZEXT816(0) << 0x40,0x3ff0000000000000);
  auVar45 = vdivpd_avx512vl(auVar45,auVar56);
  bVar42 = (bool)((byte)uVar35 & 1);
  auVar46._0_8_ = (double)((ulong)bVar42 * auVar45._0_8_ | (ulong)!bVar42 * auVar76._0_8_);
  bVar42 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar46._8_8_ = (double)((ulong)bVar42 * auVar45._8_8_ | (ulong)!bVar42 * auVar76._8_8_);
  auVar45 = vshufpd_avx(auVar44,auVar44,1);
  auVar76 = vshufpd_avx(auVar46,auVar131,1);
  auVar78._0_8_ = auVar76._0_8_ * -auVar45._0_8_;
  auVar78._8_8_ = auVar76._8_8_ * -0.0;
  auVar26 = vunpcklpd_avx(ZEXT816(0) << 0x40,auVar46);
  auVar77 = vfmadd213pd_fma(auVar26,auVar44,auVar78);
  auVar26 = vshufpd_avx(auVar46,auVar46,1);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = auVar46._0_8_ * dVar61;
  auVar26 = vfmsub213sd_fma(auVar26,auVar131,auVar79);
  if ((phi != 0.0) || (auVar97 = auVar46, NAN(phi))) {
    local_248 = cos(phi);
    dVar61 = sin(phi);
    auVar32._8_8_ = extraout_XMM0_Qb;
    auVar32._0_8_ = local_248;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = auVar26._0_8_ * dVar61;
    auVar97 = vfmadd213sd_fma(ZEXT816(0) << 0x40,auVar32,auVar99);
    auVar133 = ZEXT1664(auVar97);
    auVar118._0_8_ = auVar77._0_8_ * dVar61;
    auVar118._8_8_ = auVar77._8_8_ * dVar61;
    auVar124._8_8_ = local_248;
    auVar124._0_8_ = local_248;
    auVar97 = vfmadd231pd_fma(auVar118,auVar46,auVar124);
    auVar100._0_8_ = auVar46._0_8_ * dVar61;
    auVar100._8_8_ = auVar46._8_8_ * dVar61;
    auVar77 = vfmsub231pd_fma(auVar100,auVar77,auVar124);
    auVar80._8_8_ = 0;
    auVar80._0_8_ = dVar61 * -0.0;
    auVar26 = vfmadd231sd_fma(auVar80,auVar26,auVar32);
  }
  if (0 < this->nx) {
    auVar33._8_8_ = 0x8000000000000000;
    auVar33._0_8_ = 0x8000000000000000;
    auVar31._8_8_ = in_XMM5_Qb;
    auVar31._0_8_ = x0;
    auVar47 = vxorpd_avx512vl(auVar33,auVar31);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_288;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = (double)iVar23 * -0.5;
    auVar48 = vmulsd_avx512f(auVar101,auVar5);
    auVar134 = ZEXT1664(auVar48);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar4;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = (double)iVar24 * -0.5;
    auVar49 = vmulsd_avx512f(auVar81,auVar6);
    auVar135 = ZEXT1664(auVar49);
    auVar50 = vshufpd_avx(local_1f8,local_1f8,1);
    dVar123 = auVar50._0_8_;
    dVar96 = local_1f8._0_8_;
    dVar4 = dVar123 * dVar123 * dVar123 * dVar123;
    dVar62 = 3.141592653589793 / dVar95;
    dVar63 = -dVar62;
    dVar61 = dVar95 * dVar95 * dVar95 * dVar95;
    dVar60 = dVar96 * dVar96 * dVar96 * dVar96;
    auVar76 = vshufpd_avx(auVar76,auVar44,1);
    auVar50 = vshufpd_avx512vl(auVar77,auVar77,1);
    auVar51 = vshufpd_avx512vl(auVar97,auVar97,1);
    lVar41 = 0;
    auVar117 = ZEXT864(0) << 0x40;
    auVar52 = vxorpd_avx512vl(auVar52,auVar52);
    auVar140 = ZEXT1664(auVar52);
    auVar94 = ZEXT864(0) << 0x40;
    auVar53 = vxorpd_avx512vl(auVar53,auVar53);
    auVar139 = ZEXT1664(auVar53);
    auVar54 = vxorpd_avx512vl(auVar54,auVar54);
    auVar138 = ZEXT1664(auVar54);
    auVar54 = vxorpd_avx512vl(auVar55,auVar55);
    auVar141 = ZEXT1664(auVar54);
    uVar132 = auVar133._0_8_;
    vmovsd_avx512f(auVar48);
    vmovsd_avx512f(auVar49);
    do {
      if (0 < this->ny) {
        auVar54 = vcvtsi2sd_avx512f(in_XMM30,(int)lVar41);
        auVar136 = ZEXT1664(auVar54);
        lVar40 = 0;
        vmovsd_avx512f(auVar54);
        do {
          if (0 < this->nz) {
            auVar54 = vcvtsi2sd_avx512f(in_XMM30,(int)lVar40);
            auVar137 = ZEXT1664(auVar54);
            lVar39 = 0;
            bVar42 = false;
            uVar38 = 0;
            bVar43 = true;
            vmovsd_avx512f(auVar54);
            do {
              auVar49 = auVar141._0_16_;
              auVar52 = auVar94._0_16_;
              auVar102 = auVar117._0_16_;
              local_208 = auVar140._0_16_;
              auVar53._8_8_ = 0;
              auVar53._0_8_ = this->dx;
              auVar54 = vfmadd213sd_avx512f(auVar53,auVar136._0_16_,auVar47);
              auVar55._8_8_ = 0;
              auVar55._0_8_ = xtarget;
              auVar55 = vsubsd_avx512f(auVar54,auVar55);
              auVar125._8_8_ = 0;
              auVar125._0_8_ = this->dy;
              auVar54 = vfmadd213sd_avx512f(auVar125,auVar137._0_16_,auVar134._0_16_);
              dVar74 = (auVar54._0_8_ - y0) - ytarget;
              auVar126._8_8_ = 0;
              auVar126._0_8_ = dVar74;
              auVar54 = vmulsd_avx512f(auVar44,auVar126);
              auVar48 = vfmadd231sd_avx512f(auVar54,auVar131,auVar55);
              auVar53 = vcvtsi2sd_avx512f(in_XMM30,(int)uVar38);
              auVar54._8_8_ = 0;
              auVar54._0_8_ = this->dz;
              auVar54 = vfmadd132sd_avx512f(auVar53,auVar135._0_16_,auVar54);
              dVar64 = (auVar54._0_8_ - z0) - ztarget;
              auVar129._8_8_ = 0;
              auVar129._0_8_ = dVar64;
              auVar54 = vfmadd231sd_avx512f(auVar48,auVar45,auVar129);
              auVar54 = vucomisd_avx512f(auVar54);
              if ((bVar42 || bVar43) ||
                 (auVar7._8_8_ = 0, auVar7._0_8_ = -dVar95, auVar53 = vucomisd_avx512f(auVar7),
                 bVar42 || bVar43)) {
LAB_0010f91b:
                if (!append) {
                  pcVar25 = (this->ce).p._M_t.
                            super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                            super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                            super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar41][lVar40];
                  *(undefined8 *)((long)&pcVar25->ez + lVar39) = 0;
                  puVar1 = (undefined8 *)((long)&pcVar25->ex + lVar39);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  pcVar36 = (this->cb).p._M_t.
                            super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                            super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                            super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar41][lVar40];
                  *(undefined8 *)((long)&pcVar36->bz + lVar39) = 0;
                  puVar1 = (undefined8 *)((long)&pcVar36->bx + lVar39);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                }
              }
              else {
                auVar48 = vmulsd_avx512f(auVar51,auVar126);
                auVar48 = vfmadd231sd_avx512f(auVar48,auVar97,auVar55);
                auVar48 = vfmadd231sd_avx512f(auVar48,auVar133._0_16_,auVar129);
                vucomisd_avx512f(auVar48);
                if ((bVar42 || bVar43) ||
                   (auVar8._8_8_ = 0, auVar8._0_8_ = -dVar123, auVar48 = vucomisd_avx512f(auVar8),
                   bVar42 || bVar43)) goto LAB_0010f91b;
                auVar127._8_8_ = 0;
                auVar127._0_8_ = dVar74;
                auVar56 = vmulsd_avx512f(auVar50,auVar127);
                auVar55 = vfmadd213sd_fma(auVar55,auVar77,auVar56);
                auVar130._8_8_ = 0;
                auVar130._0_8_ = dVar64;
                auVar55 = vfmadd213sd_fma(auVar130,auVar26,auVar55);
                dVar74 = auVar55._0_8_;
                if ((dVar96 <= dVar74) || (dVar74 <= -dVar96)) goto LAB_0010f91b;
                auVar9._8_8_ = 0;
                auVar9._0_8_ = phase;
                auVar55 = vaddsd_avx512f(auVar53,auVar9);
                dVar75 = auVar55._0_8_;
                dVar64 = auVar54._0_8_;
                if (sscos == 0) {
                  auVar54 = vmulsd_avx512f(auVar53,ZEXT816(0x400921fb54442d18));
                  dVar64 = (auVar54._0_8_ * 0.5) / dVar64;
                  vmovsd_avx512f(auVar48);
                  dVar65 = cos(dVar64);
                  dVar66 = (local_288 * 3.141592653589793 * 0.5) / dVar123;
                  local_288 = cos(dVar66);
                  dVar74 = (dVar74 * 3.141592653589793 * 0.5) / dVar96;
                  dVar67 = cos(dVar74);
                  dVar64 = sin(dVar64);
                  dVar66 = sin(dVar66);
                  dVar68 = sin(dVar74);
                  dVar74 = dVar67 * local_288 * local_288 * dVar67;
                  dVar69 = cos(dVar75);
                  dVar70 = sin(dVar75);
                  auVar107._8_8_ = 0;
                  auVar107._0_8_ = dVar65;
                  auVar52._8_8_ = 0;
                  auVar52._0_8_ = dVar69 * dVar65;
                  auVar86._8_8_ = 0;
                  auVar86._0_8_ = dVar65 * dVar70 * dVar63 * dVar64;
                  auVar54 = vfmadd231sd_fma(auVar86,auVar107,auVar52);
                  local_248 = auVar54._0_8_ * dVar74 * a0y;
                  dVar69 = sin(dVar75);
                  dVar70 = cos(dVar75);
                  auVar108._8_8_ = 0;
                  auVar108._0_8_ = dVar65;
                  auVar14._8_8_ = 0;
                  auVar14._0_8_ = dVar69 * dVar65;
                  auVar87._8_8_ = 0;
                  auVar87._0_8_ = dVar65 * dVar70 * dVar62 * dVar64;
                  auVar54 = vfmadd231sd_fma(auVar87,auVar108,auVar14);
                  local_218._8_8_ = 0;
                  local_218._0_8_ = auVar54._0_8_ * dVar74 * a0z;
                  auVar30._8_8_ = 0x8000000000000000;
                  auVar30._0_8_ = 0x8000000000000000;
                  local_208 = vxorpd_avx512vl(local_218,auVar30);
                  dVar74 = sin(dVar75);
                  dVar64 = cos(dVar75);
                  auVar109._8_8_ = 0;
                  auVar109._0_8_ =
                       ((dVar67 * dVar67 * dVar65 * dVar65 * dVar74 * a0y * 3.141592653589793) /
                       dVar123) * local_288;
                  auVar15._8_8_ = 0;
                  auVar15._0_8_ = dVar66;
                  auVar88._8_8_ = 0;
                  auVar88._0_8_ =
                       ((local_288 * local_288 * dVar65 * dVar65 * dVar64 * a0z * -3.141592653589793
                        ) / dVar96) * dVar67 * dVar68;
                  auVar54 = vfmadd231sd_fma(auVar88,auVar109,auVar15);
                  local_270 = auVar54._0_8_;
                  dVar74 = cos(dVar75);
                  dVar64 = sin(dVar75);
                  auVar110._8_8_ = 0;
                  auVar110._0_8_ =
                       dVar67 * dVar67 * ((dVar65 * dVar65 * dVar74 * a0z * 3.141592653589793) /
                                         dVar123) * local_288;
                  auVar16._8_8_ = 0;
                  auVar16._0_8_ = dVar66;
                  auVar89._8_8_ = 0;
                  auVar89._0_8_ =
                       ((local_288 * local_288 * dVar65 * dVar65 * dVar64 * a0y * 3.141592653589793)
                       / dVar96) * dVar67 * dVar68;
                  auVar52 = vfmadd231sd_fma(auVar89,auVar110,auVar16);
LAB_0010fce3:
                  auVar141 = ZEXT864(local_270);
                  auVar139 = ZEXT1664(local_218);
                  auVar138 = ZEXT864((ulong)local_248);
                  auVar133 = ZEXT864(uVar132);
                  auVar102._8_8_ = 0;
                  auVar102._0_8_ = local_248;
                }
                else if (sscos == 3) {
                  auVar54 = vmulsd_avx512f(auVar53,ZEXT816(0x400921fb54442d18));
                  dVar64 = (auVar54._0_8_ * 0.5) / dVar64;
                  vmovsd_avx512f(auVar48);
                  dVar65 = cos(dVar64);
                  dVar64 = sin(dVar64);
                  auVar112._8_8_ = 0;
                  auVar112._0_8_ = local_288;
                  auVar120._8_8_ = 0;
                  auVar120._0_8_ = dVar74 * dVar74;
                  auVar54 = vfmadd213sd_fma(auVar112,auVar112,auVar120);
                  if (auVar54._0_8_ < 0.0) {
                    dVar74 = sqrt(auVar54._0_8_);
                  }
                  else {
                    auVar54 = vsqrtsd_avx(auVar54,auVar54);
                    dVar74 = auVar54._0_8_;
                  }
                  local_288 = 0.0;
                  if (dVar74 <= dVar123) {
                    local_288 = cos((dVar74 * dVar74 * dVar74 * dVar74 * 3.141592653589793 * 0.5) /
                                    dVar4);
                  }
                  dVar74 = cos(dVar75);
                  dVar66 = sin(dVar75);
                  auVar115._8_8_ = 0;
                  auVar115._0_8_ = dVar65;
                  auVar20._8_8_ = 0;
                  auVar20._0_8_ = dVar74 * dVar65;
                  auVar92._8_8_ = 0;
                  auVar92._0_8_ = dVar65 * dVar66 * dVar63 * dVar64;
                  auVar54 = vfmadd231sd_fma(auVar92,auVar115,auVar20);
                  local_248 = auVar54._0_8_ * local_288 * local_288 * a0y;
                  local_288 = local_288 * local_288 * a0z;
                  dVar74 = sin(dVar75);
                  dVar75 = cos(dVar75);
                  auVar138 = ZEXT864((ulong)local_248);
                  auVar116._8_8_ = 0;
                  auVar116._0_8_ = dVar65;
                  auVar21._8_8_ = 0;
                  auVar21._0_8_ = dVar74 * dVar65;
                  auVar93._8_8_ = 0;
                  auVar93._0_8_ = dVar65 * dVar75 * dVar62 * dVar64;
                  auVar54 = vfmadd231sd_fma(auVar93,auVar116,auVar21);
                  auVar22._8_8_ = 0;
                  auVar22._0_8_ = local_288;
                  auVar54 = vmulsd_avx512f(auVar54,auVar22);
                  auVar139 = ZEXT1664(auVar54);
                  auVar29._8_8_ = 0x8000000000000000;
                  auVar29._0_8_ = 0x8000000000000000;
                  local_208 = vxorpd_avx512vl(auVar54,auVar29);
                  auVar52 = SUB6416(ZEXT864(0),0) << 0x40;
                  auVar102._8_8_ = 0;
                  auVar102._0_8_ = local_248;
                  auVar133 = ZEXT864(uVar132);
                  auVar54 = vxorpd_avx512vl(auVar49,auVar49);
                  auVar141 = ZEXT1664(auVar54);
                }
                else if (sscos == 2) {
                  auVar54 = vmulsd_avx512f(auVar53,ZEXT816(0x400921fb54442d18));
                  dVar64 = (auVar54._0_8_ * 0.5) / dVar64;
                  vmovsd_avx512f(auVar48);
                  dVar65 = cos(dVar64);
                  dVar64 = sin(dVar64);
                  auVar111._8_8_ = 0;
                  auVar111._0_8_ = local_288;
                  auVar119._8_8_ = 0;
                  auVar119._0_8_ = dVar74 * dVar74;
                  auVar54 = vfmadd213sd_fma(auVar111,auVar111,auVar119);
                  if (auVar54._0_8_ < 0.0) {
                    dVar74 = sqrt(auVar54._0_8_);
                  }
                  else {
                    auVar54 = vsqrtsd_avx(auVar54,auVar54);
                    dVar74 = auVar54._0_8_;
                  }
                  local_288 = 1.0;
                  if ((dVar74 != 0.0) || (NAN(dVar74))) {
                    dVar74 = (dVar74 * 3.141592653589793) / ysigma;
                    local_288 = sin(dVar74);
                    local_288 = local_288 / dVar74;
                  }
                  dVar74 = cos(dVar75);
                  dVar66 = sin(dVar75);
                  auVar113._8_8_ = 0;
                  auVar113._0_8_ = dVar65;
                  auVar17._8_8_ = 0;
                  auVar17._0_8_ = dVar74 * dVar65;
                  auVar90._8_8_ = 0;
                  auVar90._0_8_ = dVar65 * dVar66 * dVar63 * dVar64;
                  auVar54 = vfmadd231sd_fma(auVar90,auVar113,auVar17);
                  local_248 = auVar54._0_8_ * local_288 * a0y;
                  local_288 = local_288 * a0z;
                  dVar74 = sin(dVar75);
                  dVar75 = cos(dVar75);
                  auVar138 = ZEXT864((ulong)local_248);
                  auVar114._8_8_ = 0;
                  auVar114._0_8_ = dVar65;
                  auVar18._8_8_ = 0;
                  auVar18._0_8_ = dVar74 * dVar65;
                  auVar91._8_8_ = 0;
                  auVar91._0_8_ = dVar65 * dVar75 * dVar62 * dVar64;
                  auVar54 = vfmadd231sd_fma(auVar91,auVar114,auVar18);
                  auVar19._8_8_ = 0;
                  auVar19._0_8_ = local_288;
                  auVar54 = vmulsd_avx512f(auVar54,auVar19);
                  auVar139 = ZEXT1664(auVar54);
                  auVar28._8_8_ = 0x8000000000000000;
                  auVar28._0_8_ = 0x8000000000000000;
                  local_208 = vxorpd_avx512vl(auVar54,auVar28);
                  auVar54 = vxorpd_avx512vl(auVar49,auVar49);
                  auVar141 = ZEXT1664(auVar54);
                  auVar52 = SUB6416(ZEXT864(0),0) << 0x40;
                  auVar102._8_8_ = 0;
                  auVar102._0_8_ = local_248;
                  auVar133 = ZEXT864(uVar132);
                }
                else if (sscos == 1) {
                  auVar54 = vmulsd_avx512f(auVar53,ZEXT816(0x400921fb54442d18));
                  auVar54 = vmulsd_avx512f(auVar53,auVar54);
                  auVar54 = vmulsd_avx512f(auVar53,auVar54);
                  auVar54 = vmulsd_avx512f(auVar53,auVar54);
                  dVar64 = (auVar54._0_8_ * 0.5) / dVar61;
                  vmovsd_avx512f(auVar48);
                  vmovsd_avx512f(auVar53);
                  dVar65 = cos(dVar64);
                  dVar66 = (local_288 * local_288 * local_288 * local_288 * 3.141592653589793 * 0.5)
                           / dVar4;
                  dVar67 = cos(dVar66);
                  dVar68 = (dVar74 * dVar74 * dVar74 * dVar74 * 3.141592653589793 * 0.5) / dVar60;
                  dVar69 = cos(dVar68);
                  dVar70 = sin(dVar64);
                  dVar66 = sin(dVar66);
                  dVar68 = sin(dVar68);
                  dVar64 = dVar69 * dVar67 * dVar67 * dVar69;
                  dVar71 = cos(dVar75);
                  dVar72 = (local_248 * local_248 * local_248 * 12.566370614359172) / dVar61;
                  dVar73 = sin(dVar75);
                  auVar103._8_8_ = 0;
                  auVar103._0_8_ = dVar65;
                  auVar10._8_8_ = 0;
                  auVar10._0_8_ = dVar71 * dVar65;
                  auVar82._8_8_ = 0;
                  auVar82._0_8_ = dVar65 * dVar73 * dVar72 * dVar70;
                  auVar54 = vfmsub231sd_fma(auVar82,auVar103,auVar10);
                  local_248 = auVar54._0_8_ * dVar64 * a0y;
                  dVar71 = sin(dVar75);
                  dVar73 = cos(dVar75);
                  auVar104._8_8_ = 0;
                  auVar104._0_8_ = dVar65;
                  auVar11._8_8_ = 0;
                  auVar11._0_8_ = dVar71 * dVar65;
                  auVar83._8_8_ = 0;
                  auVar83._0_8_ = dVar65 * dVar73 * dVar72 * dVar70;
                  auVar54 = vfmadd231sd_fma(auVar83,auVar104,auVar11);
                  local_218._8_8_ = 0;
                  local_218._0_8_ = auVar54._0_8_ * dVar64 * a0z;
                  auVar27._8_8_ = 0x8000000000000000;
                  auVar27._0_8_ = 0x8000000000000000;
                  local_208 = vxorpd_avx512vl(local_218,auVar27);
                  dVar64 = sin(dVar75);
                  dVar70 = cos(dVar75);
                  auVar105._8_8_ = 0;
                  auVar105._0_8_ =
                       dVar69 * dVar69 * dVar65 * dVar65 * ((local_288 *
                                                            local_288 *
                                                            local_288 *
                                                            dVar64 * a0y * 4.0 * 3.141592653589793)
                                                           / dVar4) * dVar67;
                  auVar12._8_8_ = 0;
                  auVar12._0_8_ = dVar66;
                  auVar84._8_8_ = 0;
                  auVar84._0_8_ =
                       dVar67 * dVar67 * dVar65 * dVar65 * ((dVar74 * dVar74 * dVar74 * dVar70 * a0z
                                                                                        * 4.0 * 
                                                  -3.141592653589793) / dVar60) * dVar69 * dVar68;
                  auVar54 = vfmadd231sd_fma(auVar84,auVar105,auVar12);
                  local_270 = auVar54._0_8_;
                  dVar64 = cos(dVar75);
                  local_288 = dVar69 * dVar69 * dVar65 * dVar65 * ((local_288 *
                                                                   local_288 *
                                                                   local_288 *
                                                                   dVar64 * a0z * 4.0 *
                                                                   3.141592653589793) / dVar4) *
                              dVar67;
                  dVar64 = sin(dVar75);
                  auVar106._8_8_ = 0;
                  auVar106._0_8_ = local_288;
                  auVar13._8_8_ = 0;
                  auVar13._0_8_ = dVar66;
                  auVar85._8_8_ = 0;
                  auVar85._0_8_ =
                       dVar67 * dVar67 * dVar65 * dVar65 * ((dVar74 * dVar74 * dVar74 * dVar64 * a0y
                                                                                        * 4.0 * 
                                                  3.141592653589793) / dVar60) * dVar69 * dVar68;
                  auVar52 = vfmadd231sd_fma(auVar85,auVar106,auVar13);
                  goto LAB_0010fce3;
                }
                auVar34._8_8_ = 0x8000000000000000;
                auVar34._0_8_ = 0x8000000000000000;
                auVar54 = vxorpd_avx512vl(local_208,auVar34);
                auVar57._0_8_ =
                     (ulong)b_sign * auVar52._0_8_ +
                     (ulong)!b_sign * (auVar52._0_8_ ^ 0x8000000000000000);
                auVar57._8_8_ = auVar52._8_8_ ^ 0x8000000000000000;
                auVar94 = ZEXT1664(auVar57);
                auVar58._0_8_ = (ulong)b_sign * local_208._0_8_ + (ulong)!b_sign * auVar54._0_8_;
                auVar58._8_8_ = auVar54._8_8_;
                auVar140 = ZEXT1664(auVar58);
                auVar59._0_8_ =
                     (ulong)b_sign * auVar102._0_8_ +
                     (ulong)!b_sign * (auVar102._0_8_ ^ 0x8000000000000000);
                auVar59._8_8_ = auVar102._8_8_ ^ 0x8000000000000000;
                auVar117 = ZEXT1664(auVar59);
                auVar55 = auVar138._0_16_;
                auVar54 = vmulsd_avx512f(auVar97,auVar55);
                auVar49 = auVar141._0_16_;
                auVar54 = vfmadd231sd_avx512f(auVar54,auVar49,auVar131);
                auVar48 = auVar139._0_16_;
                auVar54 = vfmadd231sd_avx512f(auVar54,auVar48,auVar77);
                auVar53 = vmulsd_avx512f(auVar51,auVar55);
                auVar52 = auVar133._0_16_;
                if (append) {
                  pcVar25 = (this->ce).p._M_t.
                            super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                            super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                            super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar41][lVar40];
                  auVar53 = vfmadd231sd_avx512f(auVar53,auVar49,auVar44);
                  auVar53 = vfmadd231sd_avx512f(auVar53,auVar48,auVar50);
                  auVar54 = vunpcklpd_avx(auVar54,auVar53);
                  pdVar2 = (double *)((long)&pcVar25->ex + lVar39);
                  dVar74 = pdVar2[1];
                  pdVar3 = (double *)((long)&pcVar25->ex + lVar39);
                  *pdVar3 = auVar54._0_8_ + *pdVar2;
                  pdVar3[1] = auVar54._8_8_ + dVar74;
                  auVar54 = vmulsd_avx512f(auVar52,auVar55);
                  auVar54 = vfmadd231sd_avx512f(auVar54,auVar49,auVar45);
                  auVar54 = vfmadd231sd_avx512f(auVar54,auVar48,auVar26);
                  *(double *)((long)&pcVar25->ez + lVar39) =
                       auVar54._0_8_ + *(double *)((long)&pcVar25->ez + lVar39);
                  auVar54 = vmovddup_avx512vl(auVar58);
                  auVar121._0_8_ = auVar97._0_8_ * auVar54._0_8_;
                  auVar121._8_8_ = auVar97._8_8_ * auVar54._8_8_;
                  pcVar36 = (this->cb).p._M_t.
                            super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                            super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                            super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar41][lVar40];
                  auVar128._8_8_ = auVar57._0_8_;
                  auVar128._0_8_ = auVar57._0_8_;
                  auVar54 = vfmadd132pd_fma(auVar128,auVar121,auVar76);
                  auVar122._8_8_ = auVar59._0_8_;
                  auVar122._0_8_ = auVar59._0_8_;
                  auVar54 = vfmadd213pd_fma(auVar122,auVar77,auVar54);
                  pdVar2 = (double *)((long)&pcVar36->bx + lVar39);
                  dVar74 = pdVar2[1];
                  pdVar3 = (double *)((long)&pcVar36->bx + lVar39);
                  *pdVar3 = auVar54._0_8_ + *pdVar2;
                  pdVar3[1] = auVar54._8_8_ + dVar74;
                  auVar54 = vmulsd_avx512f(auVar52,auVar58);
                  auVar54 = vfmadd213sd_fma(auVar57,auVar45,auVar54);
                  auVar54 = vfmadd213sd_fma(auVar59,auVar26,auVar54);
                  dVar74 = auVar54._0_8_ + *(double *)((long)&pcVar36->bz + lVar39);
                }
                else {
                  pcVar25 = (this->ce).p._M_t.
                            super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                            super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                            super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar41][lVar40];
                  *(long *)((long)&pcVar25->ex + lVar39) = auVar54._0_8_;
                  auVar54 = vfmadd231sd_avx512f(auVar53,auVar49,auVar44);
                  auVar54 = vfmadd231sd_avx512f(auVar54,auVar48,auVar50);
                  *(long *)((long)&pcVar25->ey + lVar39) = auVar54._0_8_;
                  auVar54 = vmulsd_avx512f(auVar52,auVar55);
                  auVar54 = vfmadd231sd_avx512f(auVar54,auVar49,auVar45);
                  auVar54 = vfmadd231sd_avx512f(auVar54,auVar48,auVar26);
                  *(long *)((long)&pcVar25->ez + lVar39) = auVar54._0_8_;
                  auVar54 = vmulsd_avx512f(auVar97,auVar58);
                  auVar54 = vfmadd231sd_fma(auVar54,auVar57,auVar131);
                  auVar54 = vfmadd231sd_fma(auVar54,auVar59,auVar77);
                  pcVar36 = (this->cb).p._M_t.
                            super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                            super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                            super__Head_base<0UL,_cellb_***,_false>._M_head_impl[lVar41][lVar40];
                  *(long *)((long)&pcVar36->bx + lVar39) = auVar54._0_8_;
                  auVar54 = vmulsd_avx512f(auVar51,auVar58);
                  auVar54 = vfmadd231sd_fma(auVar54,auVar57,auVar44);
                  auVar54 = vfmadd231sd_avx512f(auVar54,auVar59,auVar50);
                  *(long *)((long)&pcVar36->by + lVar39) = auVar54._0_8_;
                  auVar54 = vmulsd_avx512f(auVar52,auVar58);
                  auVar54 = vfmadd231sd_fma(auVar54,auVar45,auVar57);
                  auVar54 = vfmadd231sd_fma(auVar54,auVar26,auVar59);
                  dVar74 = auVar54._0_8_;
                }
                *(double *)((long)&pcVar36->bz + lVar39) = dVar74;
                auVar134 = ZEXT864(local_110);
                auVar135 = ZEXT864(local_118);
                auVar136 = ZEXT864(local_108);
                auVar137 = ZEXT864(local_100);
              }
              uVar38 = uVar38 + 1;
              uVar37 = (ulong)this->nz;
              lVar39 = lVar39 + 0x18;
              bVar42 = uVar38 < uVar37;
              bVar43 = uVar38 == uVar37;
            } while ((long)uVar38 < (long)uVar37);
          }
          lVar40 = lVar40 + 1;
        } while (lVar40 < this->ny);
      }
      lVar41 = lVar41 + 1;
    } while (lVar41 < this->nx);
  }
  return;
}

Assistant:

void spatial_region::f_init_cos(double a0y, double a0z, double xsigma, double ysigma, double zsigma, double x0, int sscos, bool b_sign, double x1, double phase, double y0, double z0, bool append, double phi, double xtarget, double ytarget, double ztarget)
{
    /* Для f_init_gauss xsigma, ysigma и zsigma имели смысл
     * половины масштабов лазерного импульса на уровне 1/e^2 (по
     * интенсивности) */
    /* x0 - расстояние от левой границы области (spatial_region'а) до
     * центра лазерного импульса, x1 - координата по x центра импульса
     * относительно центра всей области моделирования («суммы»
     * spatial_region'ов) */
    /* Интеграл от квадратов полей не вычисляется аналитически в
     * простой форме, поэтому используется \int a^2 dV. Поля задаются
     * таким образом, чтобы \int a^2 dV имел то же значение, что и для
     * f_init_gauss, поэтому вместо xsigma, ysigma и zsigma для
     * описания огибающей используются половины полных размеров
     * импульса xs, ys и zs */
    /* Если sscos==1, то огибающая задаётся в форме "супер-супер
     * косинуса"; для того, чтобы вычисление a_0 по энергии импульса
     * (при задании в конфиг-файле W) было верным, ширина импульса
     * вычисляется так, чтобы интеграл от квадрата его огибающей
     * совпадал с соответствующим интегралом от гауссова импульса */
    /* Если sscos == 2 (pearl), то поперечная огибающая для поля имеет вид (sin
     * r / r)^2, продольная - как для cos. zsigma не используется, ysigma -
     * расстояние от оси до первого нуля интенсивности в поперечном
     * распределении, xsigma - половина размера лазерного импульса на уровне
     * 1/e^2 (по интенсивности). E_x не вычисляется, а полагается равным нулю. */
    // sscos = 3 - sscos transverse, cos longutudinal
    double x,y,z,xi;
    double xs{0}, ys{0}, zs{0};
    if (sscos==0) {
        xs = xsigma*2*sqrt(2*PI)/3;
        ys = ysigma*2*sqrt(2*PI)/3;
        zs = zsigma*2*sqrt(2*PI)/3;
    } else if (sscos == 1) {
        xs = 0.822*xsigma;
        ys = 0.822*ysigma;
        zs = 0.822*zsigma;
    } else if (sscos == 2) {
        xs = xsigma * 2 * sqrt(2 * PI) / 3;
        ys = 1e2 * ysigma; // just >> ysigma
        zs = 1e2 * ysigma; // just >> ysigma
    } else if (sscos == 3) {
        xs = xsigma * 2 * sqrt(2 * PI) / 3;
        ys = 0.822 * ysigma;
        zs = 0.822 * zsigma;
    }
    double cosx,cosy,cosz,sinx,siny,sinz,tr_envelope;
    double y12,z12;
    y12 = 0.5*ny*dy;
    z12 = 0.5*nz*dz;
    double r0x,r0y,r0z;
    r0x = sqrt(x1*x1+y0*y0+z0*z0);
    r0y = -y0/r0x;
    r0z = -z0/r0x;
    r0x = -x1/r0x;
    double y0x,y0y,y0z,z0x,z0y,z0z;
    y0z = sqrt( r0x*r0x + r0y*r0y );
    if (y0z!=0)
    {
        y0x = -r0y/y0z;
        y0y = r0x/y0z;
        y0z = 0;
    }
    else
    {
        y0x = 0;
        y0y = 1;
        y0z = 0;
    }
    z0x = r0y*y0z - r0z*y0y;
    z0y = r0z*y0x - r0x*y0z;
    z0z = r0x*y0y - r0y*y0x;
    if (phi!=0) {
        double c,s,yx,yy,yz,zx,zy,zz;
        c = cos(phi);
        s = sin(phi);
        yx = y0x;
        yy = y0y;
        yz = y0z;
        zx = z0x;
        zy = z0y;
        zz = z0z;
        y0x = yx*c + zx*s;
        y0y = yy*c + zy*s;
        y0z = yz*c + zz*s;
        z0x = zx*c - yx*s;
        z0y = zy*c - yy*s;
        z0z = zz*c - yz*s;
    }
    double ex{0}, ey{0}, ez{0}, bx{0}, by{0}, bz{0};
    for(int i=0;i<nx;i++)
    {
        for(int j=0;j<ny;j++)
        {
            for(int k=0;k<nz;k++)
            {
                x = r0x*(i*dx-x0-xtarget) + r0y*(j*dy-y12-y0-ytarget) + r0z*(k*dz-z12-z0-ztarget);
                xi = x + phase;
                y = y0x*(i*dx-x0-xtarget) + y0y*(j*dy-y12-y0-ytarget) + y0z*(k*dz-z12-z0-ztarget);
                z = z0x*(i*dx-x0-xtarget) + z0y*(j*dy-y12-y0-ytarget) + z0z*(k*dz-z12-z0-ztarget);
                // vector potential envelope = (cosx*cosy*cosz)^2;
                if (x<xs&&x>-xs&&y<ys&&y>-ys&&z<zs&&z>-zs)
                {
                    if (sscos==0) {
                        cosx = cos(PI*x/2/xs);
                        cosy = cos(PI*y/2/ys);
                        cosz = cos(PI*z/2/zs);
                        sinx = sin(PI*x/2/xs);
                        siny = sin(PI*y/2/ys);
                        sinz = sin(PI*z/2/zs);
                        tr_envelope = cosy*cosy*cosz*cosz;
                        ey = a0y*tr_envelope*(cos(xi)*cosx*cosx - PI/xs*sin(xi)*cosx*sinx);
                        ez = a0z*tr_envelope*(sin(xi)*cosx*cosx + PI/xs*cos(xi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        ex = a0y*sin(xi)*cosx*cosx*cosz*cosz*PI/ys*cosy*siny - a0z*cos(xi)*cosx*cosx*cosy*cosy*PI/zs*cosz*sinz;
                        bx = a0z*cos(xi)*cosx*cosx*PI/ys*cosz*cosz*cosy*siny + a0y*sin(xi)*cosx*cosx*cosy*cosy*PI/zs*cosz*sinz;
                    } else if (sscos == 1) {
                        cosx = cos(PI*x*x*x*x/2/(xs*xs*xs*xs));
                        cosy = cos(PI*y*y*y*y/2/(ys*ys*ys*ys));
                        cosz = cos(PI*z*z*z*z/2/(zs*zs*zs*zs));
                        sinx = sin(PI*x*x*x*x/2/(xs*xs*xs*xs));
                        siny = sin(PI*y*y*y*y/2/(ys*ys*ys*ys));
                        sinz = sin(PI*z*z*z*z/2/(zs*zs*zs*zs));
                        tr_envelope = cosy*cosy*cosz*cosz;
                        ey = a0y*tr_envelope*(cos(xi)*cosx*cosx - 4*PI*x*x*x/(xs*xs*xs*xs)*sin(xi)*cosx*sinx);
                        ez = a0z*tr_envelope*(sin(xi)*cosx*cosx + 4*PI*x*x*x/(xs*xs*xs*xs)*cos(xi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        ex = a0y*sin(xi)*4*PI*y*y*y/(ys*ys*ys*ys)*cosx*cosx*cosz*cosz*cosy*siny - a0z*cos(xi)*4*PI*z*z*z/(zs*zs*zs*zs)*cosx*cosx*cosy*cosy*cosz*sinz;
                        bx = a0z*cos(xi)*4*PI*y*y*y/(ys*ys*ys*ys)*cosx*cosx*cosz*cosz*cosy*siny + a0y*sin(xi)*4*PI*z*z*z/(zs*zs*zs*zs)*cosx*cosx*cosy*cosy*cosz*sinz;
                    } else if (sscos == 2) {
                        cosx = cos(PI*x/2/xs);
                        sinx = sin(PI*x/2/xs);
                        double r = sqrt(y * y + z * z);
                        if (r != 0) {
                            siny = sin(PI * r / ysigma) / (PI * r / ysigma);
                        } else {
                            siny = 1;
                        }
                        ey = a0y * siny * (cos(xi)*cosx*cosx - PI/xs*sin(xi)*cosx*sinx);
                        ez = a0z * siny * (sin(xi)*cosx*cosx + PI/xs*cos(xi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        ex = 0;
                        bx = 0;
                    }
                    else if (sscos == 3) {
                        cosx = cos(PI*x/2/xs);
                        sinx = sin(PI*x/2/xs);
                        double r = sqrt(y * y + z * z);
                        if (r <= ys)
                        {
                            cosy = cos(PI*r*r*r*r/2/(ys*ys*ys*ys));
                        }
                        else
                        {
                            cosy = 0.0;
                        }
                        ey = a0y * cosy * cosy * (cos(xi)*cosx*cosx - PI/xs*sin(xi)*cosx*sinx);
                        ez = a0z * cosy * cosy * (sin(xi)*cosx*cosx + PI/xs*cos(xi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        ex = 0;
                        bx = 0;
                    }
                    if (b_sign==0)
                    {
                        bx = -bx;
                        by = -by;
                        bz = -bz;
                    }
                    if (append==0)
                    {
                        // прежние значения перезаписываются
                        ce[i][j][k].ex = ex*r0x + ey*y0x + ez*z0x;
                        ce[i][j][k].ey = ex*r0y + ey*y0y + ez*z0y;
                        ce[i][j][k].ez = ex*r0z + ey*y0z + ez*z0z;
                        cb[i][j][k].bx = bx*r0x + by*y0x + bz*z0x;
                        cb[i][j][k].by = bx*r0y + by*y0y + bz*z0y;
                        cb[i][j][k].bz = bx*r0z + by*y0z + bz*z0z;
                    }
                    else
                    {
                        // импульс добавляется к имеющимся полям
                        ce[i][j][k].ex += ex*r0x + ey*y0x + ez*z0x;
                        ce[i][j][k].ey += ex*r0y + ey*y0y + ez*z0y;
                        ce[i][j][k].ez += ex*r0z + ey*y0z + ez*z0z;
                        cb[i][j][k].bx += bx*r0x + by*y0x + bz*z0x;
                        cb[i][j][k].by += bx*r0y + by*y0y + bz*z0y;
                        cb[i][j][k].bz += bx*r0z + by*y0z + bz*z0z;
                    }
                }
                else if (append==0)
                {
                    ce[i][j][k].ex = 0;
                    ce[i][j][k].ey = 0;
                    ce[i][j][k].ez = 0;
                    cb[i][j][k].bx = 0;
                    cb[i][j][k].by = 0;
                    cb[i][j][k].bz = 0;
                }
            }
        }
    }
}